

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_pointerLikeType_createAddition
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePointerLikeType_,
          sysbvm_tuple_t targetPointerLikeType_,sysbvm_bitflags_t extraFlags)

{
  sysbvm_object_tuple_t *objectTuple;
  sysbvm_tuple_t newType;
  undefined1 local_68 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_956a4aa5 gcFrame;
  sysbvm_bitflags_t extraFlags_local;
  sysbvm_tuple_t targetPointerLikeType__local;
  sysbvm_tuple_t sourcePointerLikeType__local;
  sysbvm_context_t *context_local;
  
  gcFrameRecord.roots = (sysbvm_tuple_t *)sourcePointerLikeType_;
  memset(local_68,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_68);
  objectTuple = (sysbvm_object_tuple_t *)
                sysbvm_function_copy(context,(context->roots).pointerLikeElementAt);
  sysbvm_function_addFlags(context,(sysbvm_tuple_t)objectTuple,extraFlags);
  newType = sysbvm_type_createSimpleFunctionTypeWithArguments2
                      (context,(sysbvm_tuple_t)gcFrameRecord.roots,(context->roots).intptrType,
                       targetPointerLikeType_);
  sysbvm_tuple_setType(objectTuple,newType);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_68);
  return (sysbvm_tuple_t)objectTuple;
}

Assistant:

static sysbvm_tuple_t sysbvm_pointerLikeType_createAddition(sysbvm_context_t *context, sysbvm_tuple_t sourcePointerLikeType_, sysbvm_tuple_t targetPointerLikeType_, sysbvm_bitflags_t extraFlags)
{
    struct {
        sysbvm_tuple_t sourcePointerLikeType;
        sysbvm_tuple_t targetPointerLikeType;
        sysbvm_tuple_t function;
        sysbvm_tuple_t functionType;
    } gcFrame = {
        .sourcePointerLikeType = sourcePointerLikeType_,
        .targetPointerLikeType = targetPointerLikeType_,
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.function = sysbvm_function_copy(context, context->roots.pointerLikeElementAt);
    sysbvm_function_addFlags(context, gcFrame.function, extraFlags);

    gcFrame.functionType = sysbvm_type_createSimpleFunctionTypeWithArguments2(context, gcFrame.sourcePointerLikeType, context->roots.intptrType, gcFrame.targetPointerLikeType);
    sysbvm_tuple_setType((sysbvm_object_tuple_t*)gcFrame.function, gcFrame.functionType);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.function;
}